

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_vli_modAdd(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = (ulong)(byte)num_words;
  uVar3 = uVar2;
  if ('\0' < num_words) {
    uVar6 = 0;
    uVar4 = 0;
    do {
      uVar5 = left[uVar6];
      uVar8 = uVar5 + uVar4 + right[uVar6];
      uVar7 = (ulong)(uVar8 < uVar5);
      if (uVar8 == uVar5) {
        uVar7 = uVar4;
      }
      result[uVar6] = uVar8;
      uVar6 = uVar6 + 1;
      uVar4 = uVar7;
    } while (uVar2 != uVar6);
    if (uVar7 != 0) goto LAB_00107e8b;
  }
  do {
    uVar3 = uVar3 - 1;
    if ((char)uVar3 < '\0') break;
    uVar6 = (ulong)(((uint)uVar3 & 0x7f) << 3);
    uVar4 = *(ulong *)((long)mod + uVar6);
    uVar6 = *(ulong *)((long)result + uVar6);
    if (uVar6 < uVar4) {
      return;
    }
  } while (uVar6 <= uVar4);
LAB_00107e8b:
  if ('\0' < num_words) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar5 = mod[uVar4] + uVar3;
      puVar1 = result + uVar4;
      uVar6 = *puVar1;
      *puVar1 = *puVar1 - uVar5;
      if (uVar5 != 0) {
        uVar3 = (ulong)(uVar6 < uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modAdd(uECC_word_t *result,
                                  const uECC_word_t *left,
                                  const uECC_word_t *right,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t carry = uECC_vli_add(result, left, right, num_words);
    if (carry || uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
        /* result > mod (result = mod + remainder), so subtract mod to get remainder. */
        uECC_vli_sub(result, result, mod, num_words);
    }
}